

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

size_t Corrade::Containers::Implementation::
       arrayGrowth<Corrade::Containers::Triple<unsigned_long,unsigned_long,unsigned_long>>
                 (size_t currentCapacity,size_t desiredCapacity)

{
  ulong uVar1;
  ulong local_38;
  size_t candidate;
  size_t grown;
  size_t currentCapacityInBytes;
  size_t desiredCapacity_local;
  size_t currentCapacity_local;
  
  uVar1 = currentCapacity * 0x18 + 8;
  if (uVar1 < 0x10) {
    candidate = 0x10;
  }
  else if (uVar1 < 0x40) {
    candidate = uVar1 * 2;
  }
  else {
    candidate = uVar1 + (uVar1 >> 1);
  }
  local_38 = (candidate - 8) / 0x18;
  if (local_38 < desiredCapacity) {
    local_38 = desiredCapacity;
  }
  return local_38;
}

Assistant:

inline std::size_t arrayGrowth(const std::size_t currentCapacity, const std::size_t desiredCapacity) {
    /** @todo pick a nice value when current = 0 and desired > 1 */
    const std::size_t currentCapacityInBytes = sizeof(T)*currentCapacity + Implementation::AllocatorTraits<T>::Offset;

    /* For small allocations we want to tightly fit into size buckets (8, 16,
       32, 64 bytes), so it's better to double the capacity every time. For
       larger, increase just by 50%. The capacity is calculated including the
       space needed to store the capacity value (so e.g. a 16-byte allocation
       can store two ints, but when it's doubled to 32 bytes, it can store
       six of them). */
    std::size_t grown;
    if(currentCapacityInBytes < DefaultAllocationAlignment)
        grown = DefaultAllocationAlignment;
    else if(currentCapacityInBytes < 64)
        grown = currentCapacityInBytes*2;
    else
        grown = currentCapacityInBytes + currentCapacityInBytes/2;

    const std::size_t candidate = (grown - Implementation::AllocatorTraits<T>::Offset)/sizeof(T);
    return desiredCapacity > candidate ? desiredCapacity : candidate;
}